

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool pugi::impl::anon_unknown_0::node_is_before(xml_node_struct *ln,xml_node_struct *rn)

{
  bool bVar1;
  xml_node_struct *pxStack_30;
  bool left_higher;
  xml_node_struct *rp;
  xml_node_struct *lp;
  xml_node_struct *rn_local;
  xml_node_struct *ln_local;
  
  pxStack_30 = rn;
  rp = ln;
  while( true ) {
    bVar1 = false;
    if ((rp != (xml_node_struct *)0x0) && (bVar1 = false, pxStack_30 != (xml_node_struct *)0x0)) {
      bVar1 = rp->parent != pxStack_30->parent;
    }
    if (!bVar1) break;
    rp = rp->parent;
    pxStack_30 = pxStack_30->parent;
  }
  if ((rp == (xml_node_struct *)0x0) || (pxStack_30 == (xml_node_struct *)0x0)) {
    ln_local._7_1_ = (bool)((rp != (xml_node_struct *)0x0 ^ 0xffU) & 1);
    rn_local = ln;
    for (; lp = rn, rp != (xml_node_struct *)0x0; rp = rp->parent) {
      rn_local = rn_local->parent;
    }
    for (; pxStack_30 != (xml_node_struct *)0x0; pxStack_30 = pxStack_30->parent) {
      lp = lp->parent;
    }
    if (rn_local != lp) {
      for (; rn_local->parent != lp->parent; rn_local = rn_local->parent) {
        lp = lp->parent;
      }
      ln_local._7_1_ = node_is_before_sibling(rn_local,lp);
    }
  }
  else {
    ln_local._7_1_ = node_is_before_sibling(rp,pxStack_30);
  }
  return ln_local._7_1_;
}

Assistant:

PUGI__FN bool node_is_before(xml_node_struct* ln, xml_node_struct* rn)
	{
		// find common ancestor at the same depth, if any
		xml_node_struct* lp = ln;
		xml_node_struct* rp = rn;

		while (lp && rp && lp->parent != rp->parent)
		{
			lp = lp->parent;
			rp = rp->parent;
		}

		// parents are the same!
		if (lp && rp) return node_is_before_sibling(lp, rp);

		// nodes are at different depths, need to normalize heights
		bool left_higher = !lp;

		while (lp)
		{
			lp = lp->parent;
			ln = ln->parent;
		}

		while (rp)
		{
			rp = rp->parent;
			rn = rn->parent;
		}

		// one node is the ancestor of the other
		if (ln == rn) return left_higher;

		// find common ancestor... again
		while (ln->parent != rn->parent)
		{
			ln = ln->parent;
			rn = rn->parent;
		}

		return node_is_before_sibling(ln, rn);
	}